

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_def.c
# Opt level: O3

_Bool upb_FieldDef_IsPacked(upb_FieldDef *f)

{
  upb_FieldType uVar1;
  
  if ((((f->label_ == kUpb_Label_Repeated) && (uVar1 = f->type_, uVar1 != kUpb_FieldType_String)) &&
      (uVar1 != kUpb_FieldType_Bytes)) && ((uVar1 & ~kUpb_FieldType_Double) != kUpb_FieldType_Group)
     ) {
    return *(int *)((long)&f->resolved_features[2].base_dont_copy_me__upb_internal_use_only.field_0
                   + 4) == 1;
  }
  return false;
}

Assistant:

bool upb_FieldDef_IsPacked(const upb_FieldDef* f) {
  return _upb_FieldDef_IsPackable(f) &&
         UPB_DESC(FeatureSet_repeated_field_encoding(f->resolved_features)) ==
             UPB_DESC(FeatureSet_PACKED);
}